

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandRewrite(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pNtk;
  char *pcVar3;
  uint fPlaceEnable;
  char *pcVar4;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  bVar1 = false;
  Extra_UtilGetoptReset();
  local_48 = 1;
  local_44 = 0;
  local_40 = 0;
  local_3c = 0;
  fPlaceEnable = 0;
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"lxzvwh");
    switch(iVar2) {
    case 0x6c:
      local_48 = local_48 ^ 1;
      break;
    case 0x70:
      fPlaceEnable = fPlaceEnable ^ 1;
      break;
    case 0x76:
      local_40 = local_40 ^ 1;
      break;
    case 0x77:
      local_3c = local_3c ^ 1;
      break;
    case 0x78:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x7a:
      local_44 = local_44 ^ 1;
      break;
    default:
      if (iVar2 == -1) {
        if (bVar1) {
          Rwr_Precompute();
          return 0;
        }
        if (pNtk == (Abc_Ntk_t *)0x0) {
          pcVar3 = "Empty network.\n";
        }
        else if (pNtk->ntkType == ABC_NTK_STRASH) {
          iVar2 = Abc_NtkGetChoiceNum(pNtk);
          if (iVar2 == 0) {
            iVar2 = Abc_NtkRewrite(pNtk,local_48,local_44,local_40,local_3c,fPlaceEnable);
            if (iVar2 != 0) {
              return 0;
            }
            pcVar3 = "Rewriting has failed.\n";
          }
          else {
            pcVar3 = "AIG resynthesis cannot be applied to AIGs with choice nodes.\n";
          }
        }
        else {
          pcVar3 = "This command can only be applied to an AIG (run \"strash\").\n";
        }
        iVar2 = -1;
        goto LAB_002251a8;
      }
    case 0x6d:
    case 0x6e:
    case 0x6f:
    case 0x71:
    case 0x72:
    case 0x73:
    case 0x74:
    case 0x75:
    case 0x79:
      iVar2 = -2;
      Abc_Print(-2,"usage: rewrite [-lzvwh]\n");
      Abc_Print(-2,"\t         performs technology-independent rewriting of the AIG\n");
      pcVar4 = "yes";
      pcVar3 = "yes";
      if (local_48 == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-l     : toggle preserving the number of levels [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_44 == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-z     : toggle using zero-cost replacements [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_40 == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose printout [default = %s]\n",pcVar3);
      if (local_3c == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-w     : toggle printout subgraph statistics [default = %s]\n",pcVar4);
      pcVar3 = "\t-h     : print the command usage\n";
LAB_002251a8:
      Abc_Print(iVar2,pcVar3);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandRewrite( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fUpdateLevel;
    int fPrecompute;
    int fUseZeros;
    int fVerbose;
    int fVeryVerbose;
    int fPlaceEnable;
    // external functions
    extern void Rwr_Precompute();

    // set defaults
    fUpdateLevel = 1;
    fPrecompute  = 0;
    fUseZeros    = 0;
    fVerbose     = 0;
    fVeryVerbose = 0;
    fPlaceEnable = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "lxzvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'l':
            fUpdateLevel ^= 1;
            break;
        case 'x':
            fPrecompute ^= 1;
            break;
        case 'z':
            fUseZeros ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'p':
            fPlaceEnable ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( fPrecompute )
    {
        Rwr_Precompute();
        return 0;
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to an AIG (run \"strash\").\n" );
        return 1;
    }
    if ( Abc_NtkGetChoiceNum(pNtk) )
    {
        Abc_Print( -1, "AIG resynthesis cannot be applied to AIGs with choice nodes.\n" );
        return 1;
    }

    // modify the current network
    if ( !Abc_NtkRewrite( pNtk, fUpdateLevel, fUseZeros, fVerbose, fVeryVerbose, fPlaceEnable ) )
    {
        Abc_Print( -1, "Rewriting has failed.\n" );
        return 1;
    }
    return 0;

usage:
    Abc_Print( -2, "usage: rewrite [-lzvwh]\n" );
    Abc_Print( -2, "\t         performs technology-independent rewriting of the AIG\n" );
    Abc_Print( -2, "\t-l     : toggle preserving the number of levels [default = %s]\n", fUpdateLevel? "yes": "no" );
    Abc_Print( -2, "\t-z     : toggle using zero-cost replacements [default = %s]\n", fUseZeros? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose printout [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printout subgraph statistics [default = %s]\n", fVeryVerbose? "yes": "no" );
//    Abc_Print( -2, "\t-p     : toggle placement-aware rewriting [default = %s]\n", fPlaceEnable? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}